

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O2

bool __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,false>
::
push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,false>
           *this,bit_array *x,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,float kappa,
          float delta,float theta,float obj_amp)

{
  int k;
  undefined1 auVar1 [16];
  bool bVar2;
  uint r_size;
  int iVar3;
  long lVar4;
  int bk_max;
  bool bVar5;
  long lVar6;
  undefined1 auVar7 [64];
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  _Head_base<0UL,_int_*,_false> local_60;
  row_iterator local_58;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_50;
  solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,false>
  *local_48;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_40;
  int *local_38;
  undefined1 extraout_var [60];
  
  local_40._M_t.
  super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
       (tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
        )((long)this + 0x10);
  local_48 = this + 0xe8;
  bVar5 = false;
  local_50._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
  super__Head_base<0UL,_int_*,_false>._M_head_impl =
       (tuple<int_*,_std::default_delete<int[]>_>)((long)this + 0x80);
  local_38 = last._M_current;
  do {
    if (first._M_current == local_38) {
      return bVar5;
    }
    k = *first._M_current;
    lVar4 = (long)k;
    sparse_matrix<int>::row
              ((sparse_matrix<int> *)&local_60,
               (int)local_40._M_t.
                    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                    _M_head_impl);
    solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
    ::decrease_preference
              ((solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
                *)this,local_58,(row_iterator)local_60._M_head_impl,theta);
    r_size = solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
             ::compute_reduced_costs<baryonyx::bit_array>
                       ((solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
                         *)this,local_58,(row_iterator)local_60._M_head_impl,x);
    for (lVar6 = 0; (ulong)r_size * 0xc - lVar6 != 0; lVar6 = lVar6 + 0xc) {
      auVar7._0_4_ = quadratic_cost_type<float>::operator()
                               (*(quadratic_cost_type<float> **)(this + 0x160),
                                local_58[*(int *)(*(long *)(this + 0x60) + 4 + lVar6)].column,x);
      auVar7._4_60_ = extraout_var;
      auVar1 = vfmadd213ss_fma(auVar7._0_16_,ZEXT416((uint)obj_amp),
                               ZEXT416(*(uint *)(*(long *)(this + 0x60) + lVar6)));
      *(int *)(*(long *)(this + 0x60) + lVar6) = auVar1._0_4_;
    }
    switch(*(undefined1 *)(*(long *)(this + 0x68) + lVar4)) {
    case 0:
      calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*>
                (*(rc_data **)(this + 0x60),*(rc_data **)(this + 0x60) + (int)r_size,
                 *(random_engine **)(this + 8));
      iVar3 = *(int *)(*(long *)(this + 0x70) + lVar4 * 0xc);
      bk_max = *(int *)(*(long *)(this + 0x70) + 4 + lVar4 * 0xc);
LAB_0048c892:
      iVar3 = branch_and_bound_solver<baryonyx::itm::maximize_tag,float>::
              solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data[]>>>
                        ((branch_and_bound_solver<baryonyx::itm::maximize_tag,float> *)
                         local_50._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                         super__Head_base<0UL,_int_*,_false>._M_head_impl,
                         (unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
                          *)(this + 0x60),r_size,iVar3,bk_max);
      break;
    case 1:
switchD_0048c81e_caseD_1:
      iVar3 = exhaustive_solver<baryonyx::itm::maximize_tag,float>::
              solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data[]>>>
                        ((exhaustive_solver<baryonyx::itm::maximize_tag,float> *)local_48,k,
                         (unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>::rc_data[]>_>
                          *)(this + 0x60),r_size);
      break;
    case 2:
      calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*>
                (*(rc_data **)(this + 0x60),*(rc_data **)(this + 0x60) + (int)r_size,
                 *(random_engine **)(this + 8));
      lVar4 = lVar4 * 0xc;
      iVar3 = solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
              ::select_variables((solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
                                  *)this,r_size,*(int *)(*(long *)(this + 0x70) + lVar4),
                                 *(int *)(*(long *)(this + 0x70) + 4 + lVar4));
      if (iVar3 == -2) {
        iVar3 = *(int *)(*(long *)(this + 0x70) + lVar4);
        bk_max = *(int *)(*(long *)(this + 0x70) + 4 + lVar4);
        goto LAB_0048c892;
      }
      break;
    case 3:
      calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*>
                (*(rc_data **)(this + 0x60),*(rc_data **)(this + 0x60) + (int)r_size,
                 *(random_engine **)(this + 8));
      iVar3 = solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
              ::select_variables((solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
                                  *)this,r_size,*(int *)(*(long *)(this + 0x70) + lVar4 * 0xc),
                                 *(int *)(*(long *)(this + 0x70) + 4 + lVar4 * 0xc));
      if (iVar3 == -2) goto switchD_0048c81e_caseD_1;
      break;
    default:
      calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_inequalities_Zcoeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<float>,false>::rc_data*>
                (*(rc_data **)(this + 0x60),*(rc_data **)(this + 0x60) + (int)r_size,
                 *(random_engine **)(this + 8));
      iVar3 = solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
              ::select_variables_101
                        ((solver_inequalities_Zcoeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<float>,_false>
                          *)this,r_size,*(int *)(*(long *)(this + 0x70) + lVar4 * 0xc),
                         *(int *)(*(long *)(this + 0x70) + 4 + lVar4 * 0xc));
    }
    bVar2 = local_affect<baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*>
                      (this,x,local_58,k,iVar3,r_size,kappa,delta);
    bVar5 = (bool)(bVar5 | bVar2);
    first._M_current = first._M_current + 1;
  } while( true );
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float obj_amp)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto r_size =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            // Before sort and select variables, we apply the push method: for
            // each reduces cost, we had the cost multiply with an objective
            // amplifier.

            for (int i = 0; i != r_size; ++i)
                R[i].value +=
                  obj_amp * c((std::get<0>(it) + R[i].id)->column, x);

            Float pi_change;
            int selected;

            switch (Z[k]) {
            case subsolver_type::branch_and_bound:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = bb.solve(R, r_size, b[k].min, b[k].max);
                break;
            case subsolver_type::exhaustive:
                selected = ex.solve(k, R, r_size);
                break;
            case subsolver_type::unconstrained_branch_and_bound:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables(r_size, b[k].min, b[k].max);
                if (selected == -2)
                    selected = bb.solve(R, r_size, b[k].min, b[k].max);
                break;
            case subsolver_type::unconstrained_exhaustive:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables(r_size, b[k].min, b[k].max);
                if (selected == -2)
                    selected = ex.solve(k, R, r_size);
                break;
            case subsolver_type::linear:
            default:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables_101(r_size, b[k].min, b[k].max);
                break;
            }

            pi_change = local_affect(
              x, std::get<0>(it), k, selected, r_size, kappa, delta);
            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }